

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_annotator.h
# Opt level: O0

string * flatbuffers::ToHex<unsigned_long>
                   (string *__return_storage_ptr__,unsigned_long i,size_t width)

{
  _Setfill<char> _Var1;
  _Setw _Var2;
  void *this;
  undefined8 uVar3;
  ostream *poVar4;
  stringstream local_1a8 [8];
  stringstream stream;
  undefined1 local_198 [376];
  size_t local_20;
  size_t width_local;
  unsigned_long i_local;
  
  local_20 = width;
  width_local = i;
  i_local = (unsigned_long)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a8);
  this = (void *)std::ostream::operator<<(local_198,std::hex);
  uVar3 = std::ostream::operator<<(this,std::uppercase);
  _Var1 = std::setfill<char>('0');
  poVar4 = std::operator<<(uVar3,_Var1._M_c);
  _Var2 = std::setw((int)local_20);
  poVar4 = std::operator<<(poVar4,_Var2);
  std::ostream::operator<<(poVar4,width_local);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

static inline std::string ToHex(T i, size_t width = sizeof(T)) {
  std::stringstream stream;
  stream << std::hex << std::uppercase << std::setfill('0')
         << std::setw(static_cast<int>(width)) << i;
  return stream.str();
}